

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeDecl
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,bool topLevel)

{
  DatatypeValidator **ppDVar1;
  short *psVar2;
  short *psVar3;
  XMLCh XVar4;
  short sVar5;
  SchemaInfo *pSVar6;
  XMLStringPool *pXVar7;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *this_00;
  bool bVar8;
  XMLCh XVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  AttTypes type;
  XMLCh *toCheck;
  XMLCh *pXVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar16;
  DOMElement *pDVar17;
  DOMNode *node;
  undefined2 *puVar18;
  XSAnnotation *annotation;
  SchemaAttDef *pSVar19;
  long lVar20;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  unsigned_short elemContext;
  long lVar21;
  DatatypeValidator *pDVar22;
  XMLSize_t count;
  XercesAttGroupInfo *pXVar23;
  XMLCh *pXVar24;
  size_t sVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ArrayJanitor<char16_t> tempURIName;
  NamespaceScopeManager nsMgr;
  DatatypeValidator *local_98;
  XMLCh *local_90;
  XMLCh *local_80;
  XSAnnotation *local_78;
  XMLCh *local_70;
  ArrayJanitor<char16_t> local_50;
  NamespaceScopeManager local_40;
  long *plVar14;
  undefined4 extraout_var_03;
  
  pSVar6 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar6;
  toCheck = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  pXVar13 = getElementAttValue(this,elem,L"ref",QName);
  if (toCheck == (XMLCh *)0x0) {
    bVar26 = false;
  }
  else {
    bVar26 = *toCheck != L'\0';
  }
  if (pXVar13 == (XMLCh *)0x0) {
    bVar27 = true;
  }
  else {
    bVar27 = *pXVar13 == L'\0';
  }
  iVar10 = 0x10;
  if (((~bVar27 & 1U) == 0 && !bVar26) || (iVar10 = 0xf, (~topLevel & 1U) == 0 && !bVar26)) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10);
    goto LAB_0032abfa;
  }
  elemContext = 5;
  if (!topLevel) {
    elemContext = bVar27 ^ 7;
  }
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,elemContext,this,topLevel,this->fNonXSAttList);
  iVar10 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_DEFAULT);
  plVar14 = (long *)CONCAT44(extraout_var,iVar10);
  if (plVar14 == (long *)0x0) {
    local_70 = (XMLCh *)0x0;
  }
  else {
    local_70 = (XMLCh *)(**(code **)(*plVar14 + 0x150))(plVar14);
  }
  iVar10 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,&SchemaSymbols::fgATT_FIXED);
  plVar14 = (long *)CONCAT44(extraout_var_00,iVar10);
  if (plVar14 == (long *)0x0) {
    pXVar15 = (XMLCh *)0x0;
  }
  else {
    pXVar15 = (XMLCh *)(**(code **)(*plVar14 + 0x150))(plVar14);
  }
  iVar10 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,&SchemaSymbols::fgATT_USE);
  plVar14 = (long *)CONCAT44(extraout_var_01,iVar10);
  if (plVar14 == (long *)0x0) {
    local_90 = (XMLCh *)0x0;
  }
  else {
    local_90 = (XMLCh *)(**(code **)(*plVar14 + 0x150))(plVar14);
  }
  iVar10 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_FORM);
  plVar14 = (long *)CONCAT44(extraout_var_02,iVar10);
  if (plVar14 == (long *)0x0) {
    local_98 = (DatatypeValidator *)0x0;
  }
  else {
    local_98 = (DatatypeValidator *)(**(code **)(*plVar14 + 0x150))(plVar14);
  }
  pXVar16 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_TYPE,QName);
  pDVar17 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  node = &checkContent(this,elem,pDVar17,true,true)->super_DOMNode;
  local_78 = this->fAnnotation;
  bVar26 = false;
  for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
    iVar10 = (*node->_vptr_DOMNode[0x18])(node);
    puVar18 = (undefined2 *)CONCAT44(extraout_var_03,iVar10);
    if (puVar18 == &SchemaSymbols::fgELT_SIMPLETYPE) {
LAB_0032ad6b:
      pDVar17 = XUtil::getNextSiblingElement(node);
      bVar26 = (bool)(pDVar17 != (DOMElement *)0x0 | bVar26);
      break;
    }
    if (puVar18 != (undefined2 *)0x0) {
      lVar20 = 0;
      do {
        psVar2 = (short *)((long)&SchemaSymbols::fgELT_SIMPLETYPE + lVar20);
        if (*psVar2 == 0) {
          if (*(short *)((long)puVar18 + lVar20) == 0) goto LAB_0032ad6b;
          break;
        }
        psVar3 = (short *)((long)puVar18 + lVar20);
        lVar20 = lVar20 + 2;
      } while (*psVar2 == *psVar3);
    }
    bVar26 = true;
  }
  if (bVar26) {
    pXVar24 = toCheck;
    if (toCheck == (XMLCh *)0x0) {
      pXVar24 = pXVar13;
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x4e,pXVar24,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  local_80 = pXVar15;
  if (local_70 != (XMLCh *)0x0) {
    if (pXVar15 != (XMLCh *)0x0) {
      pXVar15 = toCheck;
      if (toCheck == (XMLCh *)0x0) {
        pXVar15 = pXVar13;
      }
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x2f,pXVar15,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar15 = local_70;
    if (local_90 == (XMLCh *)0x0) {
      local_90 = (XMLCh *)0x0;
      local_80 = (XMLCh *)0x0;
    }
    else {
      XVar9 = *local_90;
      if (XVar9 == L'\0') {
LAB_0032aeb0:
        local_80 = (XMLCh *)0x0;
      }
      else if (local_90 == L"optional") {
        local_80 = (XMLCh *)0x0;
        local_90 = L"optional";
      }
      else {
        lVar20 = 0;
        do {
          lVar21 = lVar20;
          if (XVar9 != *(XMLCh *)((long)&SchemaSymbols::fgATTVAL_OPTIONAL + lVar21))
          goto LAB_0032ae48;
          XVar9 = *(XMLCh *)((long)local_90 + lVar21 + 2);
          lVar20 = lVar21 + 2;
        } while (XVar9 != L'\0');
        if (*(short *)((long)&DAT_003687b2 + lVar21) == 0) goto LAB_0032aeb0;
LAB_0032ae48:
        pXVar24 = toCheck;
        if (toCheck == (XMLCh *)0x0) {
          pXVar24 = pXVar13;
        }
        local_90 = (XMLCh *)0x0;
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x30,pXVar24,
                          (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        local_80 = (XMLCh *)0x0;
      }
    }
  }
  if (bVar27 == false && !topLevel) {
    if ((local_98 != (DatatypeValidator *)0x0 || pXVar16 != (XMLCh *)0x0) || node != (DOMNode *)0x0)
    {
      pXVar15 = pXVar13;
      if (toCheck != (XMLCh *)0x0) {
        pXVar15 = toCheck;
      }
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x45,pXVar15,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    processAttributeDeclRef(this,elem,typeInfo,pXVar13,local_90,local_70,local_80);
  }
  else {
    annotation = local_78;
    if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
        (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)) {
      annotation = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
      this->fAnnotation = annotation;
      if (local_78 != (XSAnnotation *)0x0) {
        (*(local_78->super_XSerializable)._vptr_XSerializable[1])();
      }
    }
    if (toCheck == (XMLCh *)0x0) {
      count = 0;
    }
    else {
      lVar20 = 0;
      do {
        psVar2 = (short *)((long)toCheck + lVar20);
        lVar20 = lVar20 + 2;
      } while (*psVar2 != 0);
      count = (lVar20 >> 1) - 1;
    }
    bVar26 = XMLChar1_0::isValidNCName(toCheck,count);
    local_78 = annotation;
    if (bVar26 && toCheck != L"xmlns") {
      pXVar13 = L"xmlns";
      pXVar24 = toCheck;
      if (toCheck == (XMLCh *)0x0) {
LAB_0032b028:
        if (*pXVar13 == L'\0') goto LAB_0032b0b9;
      }
      else {
        do {
          XVar9 = *pXVar24;
          if (XVar9 == L'\0') goto LAB_0032b028;
          pXVar24 = pXVar24 + 1;
          XVar4 = *pXVar13;
          pXVar13 = pXVar13 + 1;
        } while (XVar9 == XVar4);
      }
      uVar12 = this->fEmptyNamespaceURI;
      pXVar13 = this->fTargetNSURIString;
      pXVar24 = L"http://www.w3.org/2001/XMLSchema-instance";
      if (pXVar13 != (XMLCh *)0x0) {
        if (*pXVar13 != L'\0') {
          if (((topLevel) || (bVar26 = XMLString::equals((XMLCh *)local_98,L"qualified"), bVar26))
             || (((this->fSchemaInfo->fElemAttrDefaultQualified & 2) != 0 &&
                 ((local_98 == (DatatypeValidator *)0x0 || (*(XMLCh *)local_98 == L'\0')))))) {
            uVar12 = this->fTargetNSURI;
          }
          pXVar13 = this->fTargetNSURIString;
        }
        if (pXVar13 == L"http://www.w3.org/2001/XMLSchema-instance") goto LAB_0032b1b1;
        if (pXVar13 == (XMLCh *)0x0) goto LAB_0032b0ea;
        pXVar24 = L"http://www.w3.org/2001/XMLSchema-instance";
        do {
          XVar9 = *pXVar13;
          if (XVar9 == L'\0') goto LAB_0032b0ea;
          pXVar13 = pXVar13 + 1;
          XVar4 = *pXVar24;
          pXVar24 = pXVar24 + 1;
        } while (XVar9 == XVar4);
LAB_0032b0f5:
        if (typeInfo != (ComplexTypeInfo *)0x0) {
          pSVar19 = RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::get
                              (typeInfo->fAttDefs,toCheck,uVar12);
          iVar10 = 0x31;
          if (pSVar19 != (SchemaAttDef *)0x0) goto LAB_0032b1b6;
        }
        if (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0) {
          bVar26 = XercesAttGroupInfo::containsAttribute(this->fCurrentAttGroupInfo,toCheck,uVar12);
          iVar10 = 0x31;
          if (bVar26) goto LAB_0032b1b6;
        }
        pSVar6 = this->fSchemaInfo;
        if (node == (DOMNode *)0x0) {
          if ((pXVar16 == (XMLCh *)0x0) || (*pXVar16 == L'\0')) {
            local_98 = DatatypeValidatorFactory::getDatatypeValidator
                                 (this->fDatatypeRegistry,L"anySimpleType");
            goto LAB_0032b2dd;
          }
          checkEnumerationRequiredNotation(this,elem,toCheck,pXVar16);
          pXVar13 = getLocalPart(this,pXVar16);
          pXVar16 = getPrefix(this,pXVar16);
          pXVar16 = resolvePrefixToURI(this,elem,pXVar16);
          bVar26 = XMLString::equals(pXVar16,L"http://www.w3.org/2001/XMLSchema");
          if (bVar26) {
            local_98 = DatatypeValidatorFactory::getDatatypeValidator
                                 (this->fDatatypeRegistry,pXVar13);
            if (local_98 == (DatatypeValidator *)0x0) {
LAB_0032b822:
              reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x33,pXVar16,
                                pXVar13,toCheck,(XMLCh *)0x0);
              local_98 = (DatatypeValidator *)0x0;
              goto LAB_0032b2dd;
            }
LAB_0032b863:
            bVar26 = XMLString::equals(pXVar13,L"ID");
            if (bVar26) {
              type = ID;
            }
            else {
              bVar26 = XMLString::equals(pXVar13,(XMLCh *)XMLUni::fgIDRefString);
              if (bVar26) {
                type = IDRef;
              }
              else {
                bVar26 = XMLString::equals(pXVar13,(XMLCh *)XMLUni::fgIDRefsString);
                if (bVar26) {
                  type = IDRefs;
                }
                else {
                  bVar26 = XMLString::equals(pXVar13,L"ENTITY");
                  if (bVar26) {
                    type = Entity;
                  }
                  else {
                    bVar26 = XMLString::equals(pXVar13,(XMLCh *)XMLUni::fgEntitiesString);
                    if (bVar26) {
                      type = Entities;
                    }
                    else {
                      bVar26 = XMLString::equals(pXVar13,(XMLCh *)XMLUni::fgNmTokenString);
                      if (bVar26) {
                        type = NmToken;
                      }
                      else {
                        bVar26 = XMLString::equals(pXVar13,(XMLCh *)XMLUni::fgNmTokensString);
                        if (bVar26) {
                          type = NmTokens;
                        }
                        else {
                          bVar26 = XMLString::equals(pXVar13,L"NOTATION");
                          type = (uint)!bVar26 * 2 + Notation;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            local_98 = getAttrDatatypeValidatorNS(this,elem,pXVar13,pXVar16);
            pDVar22 = local_98;
            if (local_98 == (DatatypeValidator *)0x0) goto LAB_0032b822;
            do {
              bVar26 = XMLString::equals(pDVar22->fTypeUri,L"http://www.w3.org/2001/XMLSchema");
              if (bVar26) {
                pXVar13 = pDVar22->fTypeLocalName;
                goto LAB_0032b863;
              }
              ppDVar1 = &pDVar22->fBaseValidator;
              type = Simple;
              pDVar22 = *ppDVar1;
            } while (*ppDVar1 != (DatatypeValidator *)0x0);
          }
        }
        else {
          if ((pXVar16 != (XMLCh *)0x0) && (*pXVar16 != L'\0')) {
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x32,toCheck,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          local_98 = traverseSimpleTypeDecl(this,(DOMElement *)node,false,0);
LAB_0032b2dd:
          type = Simple;
        }
        this->fSchemaInfo = pSVar6;
        if ((local_90 == (XMLCh *)0x0) || (XVar9 = *local_90, XVar9 == L'\0')) {
LAB_0032b36e:
          bVar26 = false;
LAB_0032b370:
          bVar27 = false;
        }
        else {
          bVar26 = true;
          if (local_90 == L"required") goto LAB_0032b370;
          lVar20 = 0;
          do {
            lVar21 = lVar20;
            if (XVar9 != *(XMLCh *)((long)&SchemaSymbols::fgATTVAL_REQUIRED + lVar21))
            goto LAB_0032b334;
            XVar9 = *(XMLCh *)((long)local_90 + lVar21 + 2);
            lVar20 = lVar21 + 2;
          } while (XVar9 != L'\0');
          if (*(short *)((long)&DAT_00368822 + lVar21) == 0) goto LAB_0032b370;
LAB_0032b334:
          if (local_90 != L"prohibited") {
            lVar20 = 0;
            do {
              psVar2 = (short *)((long)local_90 + lVar20);
              if (*psVar2 == 0) {
                bVar27 = *(short *)((long)&SchemaSymbols::fgATTVAL_PROHIBITED + lVar20) == 0;
                goto LAB_0032b573;
              }
              psVar3 = (short *)((long)&SchemaSymbols::fgATTVAL_PROHIBITED + lVar20);
              lVar20 = lVar20 + 2;
            } while (*psVar2 == *psVar3);
            goto LAB_0032b36e;
          }
          bVar27 = true;
LAB_0032b573:
          bVar26 = false;
        }
        if (local_98 == (DatatypeValidator *)0x0) {
          bVar8 = pXVar15 != (XMLCh *)0x0;
          bVar28 = false;
LAB_0032b3c5:
          if ((type == Entities || (type & ~Entity) == IDRefs) &&
             ((bVar8 && (bVar8 = XMLString::isWSCollapsed(pXVar15), !bVar8)))) {
            sVar25 = 0;
            do {
              psVar2 = (short *)((long)pXVar15 + sVar25);
              sVar25 = sVar25 + 2;
            } while (*psVar2 != 0);
            iVar10 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar25);
            pXVar13 = (XMLCh *)CONCAT44(extraout_var_04,iVar10);
            memcpy(pXVar13,pXVar15,sVar25);
            ArrayJanitor<char16_t>::ArrayJanitor(&local_50,pXVar13,this->fMemoryManager);
            XMLString::collapseWS(pXVar13,this->fMemoryManager);
            pXVar7 = this->fStringPool;
            uVar11 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7,pXVar13);
            iVar10 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])(pXVar7,(ulong)uVar11);
            pXVar15 = (XMLCh *)CONCAT44(extraout_var_05,iVar10);
            ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
          }
        }
        else {
          bVar28 = local_98->fType == ID;
          bVar8 = pXVar15 != (XMLCh *)0x0;
          if ((pXVar15 == (XMLCh *)0x0) || (type != Simple)) goto LAB_0032b3c5;
          sVar5 = local_98->fWhiteSpace;
          if (sVar5 == 1) {
            bVar8 = XMLString::isWSReplaced(pXVar15);
LAB_0032b494:
            if (bVar8 == false) {
              sVar25 = 0;
              do {
                psVar2 = (short *)((long)pXVar15 + sVar25);
                sVar25 = sVar25 + 2;
              } while (*psVar2 != 0);
              iVar10 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar25);
              pXVar13 = (XMLCh *)CONCAT44(extraout_var_06,iVar10);
              memcpy(pXVar13,pXVar15,sVar25);
              ArrayJanitor<char16_t>::ArrayJanitor(&local_50,pXVar13,this->fMemoryManager);
              if (sVar5 == 1) {
                XMLString::replaceWS(pXVar13,this->fMemoryManager);
              }
              else if (sVar5 == 2) {
                XMLString::collapseWS(pXVar13,this->fMemoryManager);
              }
              pXVar7 = this->fStringPool;
              uVar11 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7,pXVar13);
              iVar10 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])
                                 (pXVar7,(ulong)uVar11);
              pXVar15 = (XMLCh *)CONCAT44(extraout_var_07,iVar10);
              ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
            }
          }
          else if (sVar5 == 2) {
            bVar8 = XMLString::isWSCollapsed(pXVar15);
            goto LAB_0032b494;
          }
          (*(local_98->super_XSerializable)._vptr_XSerializable[8])
                    (local_98,pXVar15,this->fSchemaInfo->fValidationContext,this->fMemoryManager);
        }
        if ((bVar28) && (pXVar15 != (XMLCh *)0x0)) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x88,toCheck,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        if (bVar28 && !topLevel) {
          pXVar23 = this->fCurrentAttGroupInfo;
          if (pXVar23 == (XercesAttGroupInfo *)0x0) {
            iVar10 = 0x89;
            if (typeInfo->fAttWithTypeId == true) goto LAB_0032b659;
            typeInfo->fAttWithTypeId = true;
          }
          else {
            iVar10 = 0x8a;
            if (pXVar23->fTypeWithId != false) {
LAB_0032b659:
              reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10,toCheck
                                ,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
              goto LAB_0032b1d9;
            }
            pXVar23->fTypeWithId = true;
          }
        }
        pSVar19 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
        SchemaAttDef::SchemaAttDef
                  (pSVar19,L"",toCheck,uVar12,type,Implied,this->fGrammarPoolMemoryManager);
        pSVar19->fDatatypeValidator = local_98;
        if (bVar27) {
          (pSVar19->super_XMLAttDef).fDefaultType = DefAttTypes_Max;
        }
        else if (bVar26) {
          if (local_80 == (XMLCh *)0x0) {
            (pSVar19->super_XMLAttDef).fDefaultType = Required;
          }
          else {
            (pSVar19->super_XMLAttDef).fDefaultType = Required_And_Fixed;
          }
        }
        else if (local_80 == (XMLCh *)0x0) {
          if (local_70 != (XMLCh *)0x0) {
            (pSVar19->super_XMLAttDef).fDefaultType = DefAttTypes_Min;
          }
        }
        else {
          (pSVar19->super_XMLAttDef).fDefaultType = Fixed;
        }
        if (pXVar15 != (XMLCh *)0x0) {
          XMLAttDef::setValue((XMLAttDef *)pSVar19,pXVar15);
        }
        if (annotation != (XSAnnotation *)0x0) {
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,pSVar19,annotation);
        }
        if (topLevel) {
          pXVar7 = this->fStringPool;
          this_00 = this->fAttributeDeclRegistry;
          uVar12 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])(pXVar7,toCheck);
          iVar10 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])(pXVar7,(ulong)uVar12);
          RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::put
                    (this_00,(void *)CONCAT44(extraout_var_08,iVar10),(XMLAttDef *)pSVar19);
          pSVar19->fPSVIScope = SCP_GLOBAL;
        }
        else {
          if (typeInfo == (ComplexTypeInfo *)0x0) {
            pXVar23 = this->fCurrentAttGroupInfo;
            if (pXVar23 == (XercesAttGroupInfo *)0x0) goto LAB_0032abfa;
          }
          else {
            ComplexTypeInfo::addAttDef(typeInfo,pSVar19);
            pXVar23 = this->fCurrentAttGroupInfo;
            if (pXVar23 == (XercesAttGroupInfo *)0x0) {
              pSVar19->fPSVIScope = SCP_LOCAL;
              goto LAB_0032abfa;
            }
          }
          XercesAttGroupInfo::addAttDef(pXVar23,pSVar19,typeInfo != (ComplexTypeInfo *)0x0);
        }
        goto LAB_0032abfa;
      }
LAB_0032b0ea:
      if (*pXVar24 != L'\0') goto LAB_0032b0f5;
LAB_0032b1b1:
      iVar10 = 0x95;
LAB_0032b1b6:
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10,toCheck,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    else {
LAB_0032b0b9:
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x35,L"attribute",
                        toCheck,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
LAB_0032b1d9:
  if (local_78 != (XSAnnotation *)0x0) {
    (*(local_78->super_XSerializable)._vptr_XSerializable[1])();
  }
LAB_0032abfa:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::traverseAttributeDecl(const DOMElement* const elem,
                                           ComplexTypeInfo* const typeInfo,
                                           const bool topLevel) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    const XMLCh*   name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    const XMLCh*   ref = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
    bool           nameEmpty = (!name || !*name);
    bool           refEmpty = (!ref || !*ref);

    if (nameEmpty && refEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefAttribute);
        return;
    }

    if (topLevel && nameEmpty) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelNoNameAttribute);
        return;
    }

    // ------------------------------------------------------------------
    // Check attributes
    // ------------------------------------------------------------------
    unsigned short scope = (topLevel)
        ? GeneralAttributeCheck::E_AttributeGlobal
        : (refEmpty) ? GeneralAttributeCheck::E_AttributeLocal
                     : GeneralAttributeCheck::E_AttributeRef;

    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    const XMLCh* defaultVal = getElementAttValue(elem, SchemaSymbols::fgATT_DEFAULT);
    const XMLCh* fixedVal = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);
    const XMLCh* useVal = getElementAttValue(elem, SchemaSymbols::fgATT_USE);
    const XMLCh* attForm = getElementAttValue(elem, SchemaSymbols::fgATT_FORM);
    const XMLCh* dvType = getElementAttValue(elem, SchemaSymbols::fgATT_TYPE, DatatypeValidator::QName);
    DOMElement* simpleType = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    Janitor<XSAnnotation> janAnnot(fAnnotation);
    bool         badContent = false;

    while (simpleType != 0) {

        const XMLCh* contentName = simpleType->getLocalName();

        if (XMLString::equals(SchemaSymbols::fgELT_SIMPLETYPE, contentName)) {

            if (XUtil::getNextSiblingElement(simpleType) != 0) {
                badContent = true;
            }
            break;
        }

        badContent = true;
        simpleType = XUtil::getNextSiblingElement(simpleType);
    }

    if (badContent) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAttributeContent,
                          (name) ? name : ref);
    }

    if (defaultVal) {

        if (fixedVal) {

            fixedVal = 0;
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeDefaultFixedValue,
                              (name) ? name : ref);
        }

        if ((useVal && *useVal)
            && !XMLString::equals(useVal, SchemaSymbols::fgATTVAL_OPTIONAL)) {

            useVal = 0;
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotOptionalDefaultAttValue,
                              (name) ? name : ref);
        }
    }

    // processing ref
    if (!refEmpty && !topLevel) {

        // Check ref representation OK - 3.2.3::3.2
        if (attForm || dvType || (simpleType != 0)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeRefContentError,
                              (name) ? name : ref);
        }

        processAttributeDeclRef(elem, typeInfo, ref, useVal, defaultVal, fixedVal);
        return;
    }

    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        janAnnot.reset(fAnnotation);
    }

    // processing 'name'
    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))
        || XMLString::equals(name, XMLUni::fgXMLNSString)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName, SchemaSymbols::fgELT_ATTRIBUTE, name);
        return;
    }

    // Check for duplicate declaration
    const XMLCh* qualified = SchemaSymbols::fgATTVAL_QUALIFIED;
    int uriIndex = fEmptyNamespaceURI;

    if ((fTargetNSURIString && *fTargetNSURIString)
        && (topLevel || XMLString::equals(attForm, qualified)
            || ((fSchemaInfo->getElemAttrDefaultQualified() & Attr_Def_Qualified)
                && (!attForm || !*attForm)))) {
        uriIndex = fTargetNSURI;
    }

    // make sure that attribute namespace is not xsi uri
    if (XMLString::equals(fTargetNSURIString, SchemaSymbols::fgURI_XSI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAttTNS, name);
        return;
    }

    if (typeInfo && typeInfo->getAttDef(name, uriIndex) != 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, name);
        return;
    }
    else if (fCurrentAttGroupInfo && fCurrentAttGroupInfo->containsAttribute(name, uriIndex)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, name);
        return;
    }

    DatatypeValidator*  dv = 0;
    XMLAttDef::AttTypes attType = XMLAttDef::Simple;
    SchemaInfo* saveInfo = fSchemaInfo;

    if (simpleType != 0) {

        if (dvType && *dvType) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeWithTypeAndSimpleType, name);
        }

        dv = traverseSimpleTypeDecl(simpleType, false);
    }
    else if (!dvType || !*dvType) {
        dv = fDatatypeRegistry->getDatatypeValidator(SchemaSymbols::fgDT_ANYSIMPLETYPE);
    }
    else {

        checkEnumerationRequiredNotation(elem, name, dvType);

        const XMLCh* localPart = getLocalPart(dvType);
        const XMLCh* prefix = getPrefix(dvType);
        const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);
        DatatypeValidator*  dvBack = 0;

        if (XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
            dv = fDatatypeRegistry->getDatatypeValidator(localPart);
            dvBack = dv;
        }
        else { //isn't of the schema for schemas namespace...

            dv = getAttrDatatypeValidatorNS(elem, localPart, typeURI);
            dvBack = dv;

            while(dv != 0 && !XMLString::equals(dv->getTypeUri(), SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
                dv = dv->getBaseValidator();
            }

            if(dv)
                localPart = dv->getTypeLocalName();
        }

        if(dv) {
            if (XMLString::equals(localPart,XMLUni::fgIDString)) {
                attType = XMLAttDef::ID;
            }
            else if (XMLString::equals(localPart,XMLUni::fgIDRefString)) {
                attType = XMLAttDef::IDRef;
            }
            else if (XMLString::equals(localPart,XMLUni::fgIDRefsString)) {
                attType = XMLAttDef::IDRefs;
            }
            else if (XMLString::equals(localPart,XMLUni::fgEntityString)) {
                attType = XMLAttDef::Entity;
            }
            else if (XMLString::equals(localPart,XMLUni::fgEntitiesString)) {
                attType = XMLAttDef::Entities;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNmTokenString)) {
                attType = XMLAttDef::NmToken;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNmTokensString)) {
                attType = XMLAttDef::NmTokens;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNotationString)) {
                attType = XMLAttDef::Notation;
            }
            else {
                attType = XMLAttDef::Simple;
            }
        }
        else
            attType = XMLAttDef::Simple;

        dv = dvBack;

        if (!dv) {
            reportSchemaError
            (
                elem
                , XMLUni::fgXMLErrDomain
                , XMLErrs::AttributeSimpleTypeNotFound
                , typeURI
                , localPart
                , name
            );
        }
    }

    // restore schema information, if necessary
    fSchemaInfo = saveInfo;

    bool required = false;
    bool prohibited = false;

    if (useVal && *useVal) {

        if (XMLString::equals(useVal, SchemaSymbols::fgATTVAL_REQUIRED)) {
            required = true;
        }
        else if (XMLString::equals(useVal, SchemaSymbols::fgATTVAL_PROHIBITED)) {
            prohibited = true;
        }
    }

    // validate fixed/default values
    const XMLCh* valueToCheck = defaultVal ? defaultVal : fixedVal;
    bool  ofTypeID = (dv && dv->getType() == DatatypeValidator::ID);

    if (attType == XMLAttDef::Simple && dv && valueToCheck) {

        short wsFacet = dv->getWSFacet();
        if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(valueToCheck)) ||
           (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(valueToCheck)))
        {
            XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
            ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
            if(wsFacet == DatatypeValidator::REPLACE)
                XMLString::replaceWS(normalizedValue, fMemoryManager);
            else if(wsFacet == DatatypeValidator::COLLAPSE)
                XMLString::collapseWS(normalizedValue, fMemoryManager);
            valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
        }
        try {
            dv->validate(valueToCheck
                      , fSchemaInfo->getValidationContext()
                      , fMemoryManager);
        }
        catch (const XMLException& excep) {
            reportSchemaError(elem, excep);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...) {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valueToCheck);
        }
    }
    else if((attType == XMLAttDef::NmTokens || attType==XMLAttDef::IDRefs || attType==XMLAttDef::Entities) &&
            valueToCheck && !XMLString::isWSCollapsed(valueToCheck))
    {
        XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
        ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
        XMLString::collapseWS(normalizedValue, fMemoryManager);
        valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
    }

    if (ofTypeID && valueToCheck) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect3, name);
    }

    // check for multiple attributes with type derived from ID
    if (!topLevel && ofTypeID) {

        if (fCurrentAttGroupInfo) {

            if (fCurrentAttGroupInfo->containsTypeWithId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, name);
                return;
            }

            fCurrentAttGroupInfo->setTypeWithId(true);
        }
        else {

            if (typeInfo->containsAttWithTypeId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, name);
                return;
            }

            typeInfo->setAttWithTypeId(true);
        }
    }

    // create SchemaAttDef
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef
    (
        XMLUni::fgZeroLenString
        , name
        , uriIndex
        , attType
        , XMLAttDef::Implied
        , fGrammarPoolMemoryManager
    );

    attDef->setDatatypeValidator(dv);

    if (prohibited) {
        attDef->setDefaultType(XMLAttDef::Prohibited);
    }
    else if (required) {

        if (fixedVal) {
            attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
        }
        else {
            attDef->setDefaultType(XMLAttDef::Required);
        }
    }
    else {

        if (fixedVal) {
            attDef->setDefaultType(XMLAttDef::Fixed);
        }
        else if (defaultVal) {
            attDef->setDefaultType(XMLAttDef::Default);
        }
    }

    if (valueToCheck) {
        attDef->setValue(valueToCheck);
    }

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(attDef, janAnnot.release());

    if (topLevel)
    {
        fAttributeDeclRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)), attDef);
        attDef->setPSVIScope(PSVIDefs::SCP_GLOBAL);
    }
    else
    {
        if (typeInfo)
        {
            typeInfo->addAttDef(attDef);
            if (!fCurrentAttGroupInfo)
                attDef->setPSVIScope(PSVIDefs::SCP_LOCAL);
        }

        if (fCurrentAttGroupInfo) {
            fCurrentAttGroupInfo->addAttDef(attDef, (typeInfo != 0));
        }
    }
}